

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBrVar(WatWriter *this,Var *var,NextChar next_char)

{
  bool bVar1;
  Index IVar2;
  char *pcVar3;
  char *pcVar4;
  string *str;
  int __c;
  int __c_00;
  int __c_01;
  Var *__s;
  NextChar next_char_local;
  Var *var_local;
  WatWriter *this_local;
  
  __s = var;
  bVar1 = Var::is_index(var);
  if (bVar1) {
    pcVar3 = Var::index(var,(char *)__s,__c);
    IVar2 = ModuleContext::GetLabelStackSize(&this->super_ModuleContext);
    if ((uint)pcVar3 < IVar2) {
      pcVar3 = Var::index(var,(char *)__s,__c_00);
      IVar2 = ModuleContext::GetLabelStackSize(&this->super_ModuleContext);
      pcVar4 = Var::index(var,(char *)__s,__c_01);
      Writef(this,"%u (;@%u;)",(ulong)pcVar3 & 0xffffffff,(ulong)((IVar2 - (int)pcVar4) - 1));
    }
    else {
      pcVar3 = Var::index(var,(char *)__s,__c_00);
      Writef(this,"%u (; INVALID ;)",(ulong)pcVar3 & 0xffffffff);
    }
    this->next_char_ = next_char;
  }
  else {
    str = Var::name_abi_cxx11_(var);
    WriteString(this,str,next_char);
  }
  return;
}

Assistant:

void WatWriter::WriteBrVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    if (var.index() < GetLabelStackSize()) {
      Writef("%" PRIindex " (;@%" PRIindex ";)", var.index(),
             GetLabelStackSize() - var.index() - 1);
    } else {
      Writef("%" PRIindex " (; INVALID ;)", var.index());
    }
    next_char_ = next_char;
  } else {
    WriteString(var.name(), next_char);
  }
}